

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_support.c
# Opt level: O0

int ossl_ec_curve_name2nid(char *name)

{
  int iVar1;
  char *in_RDI;
  int nid;
  size_t i;
  char *in_stack_ffffffffffffffd8;
  ulong local_18;
  
  if (in_RDI != (char *)0x0) {
    iVar1 = ossl_ec_curve_nist2nid_int(in_stack_ffffffffffffffd8);
    if (iVar1 != 0) {
      return iVar1;
    }
    for (local_18 = 0; local_18 < 0x52; local_18 = local_18 + 1) {
      iVar1 = strcasecmp(curve_list[local_18].name,in_RDI);
      if (iVar1 == 0) {
        return curve_list[local_18].nid;
      }
    }
  }
  return 0;
}

Assistant:

int ossl_ec_curve_name2nid(const char *name)
{
    size_t i;
    int nid;

    if (name != NULL) {
        if ((nid = ossl_ec_curve_nist2nid_int(name)) != NID_undef)
            return nid;

        for (i = 0; i < OSSL_NELEM(curve_list); i++) {
            if (strcasecmp(curve_list[i].name, name) == 0)
                return curve_list[i].nid;
        }
    }

    return NID_undef;
}